

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

QRectF * __thiscall
QWidgetEffectSourcePrivate::boundingRect(QWidgetEffectSourcePrivate *this,CoordinateSystem system)

{
  QRect *pQVar1;
  int in_EDX;
  QRectF *in_RSI;
  QRectF *in_RDI;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffff78;
  QRectF *pQVar2;
  undefined4 in_stack_ffffffffffffff98;
  char local_38 [32];
  QRect local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_EDX == 0) {
    if ((char *)in_RSI[4].h == (char *)0x0) {
      pQVar2 = in_RDI;
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_RSI,(char *)in_RDI,(int)((ulong)in_RDI >> 0x20),
                 in_stack_ffffffffffffff78);
      QMessageLogger::warning
                (local_38,
                 "QGraphicsEffectSource::boundingRect: Not yet implemented, lacking device context")
      ;
      QRectF::QRectF(in_RDI);
    }
    else {
      pQVar1 = (QRect *)QPainter::worldTransform();
      QWidget::rect((QWidget *)CONCAT44(in_EDX,in_stack_ffffffffffffff98));
      QTransform::mapRect(pQVar1);
      QRectF::QRectF(in_RSI,(QRect *)in_RDI);
      pQVar2 = in_RDI;
    }
  }
  else {
    local_18 = QWidget::rect((QWidget *)CONCAT44(in_EDX,in_stack_ffffffffffffff98));
    QRectF::QRectF(in_RSI,(QRect *)in_RDI);
    pQVar2 = in_RDI;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QRectF QWidgetEffectSourcePrivate::boundingRect(Qt::CoordinateSystem system) const
{
    if (system != Qt::DeviceCoordinates)
        return m_widget->rect();

    if (Q_UNLIKELY(!context)) {
        // Device coordinates without context not yet supported.
        qWarning("QGraphicsEffectSource::boundingRect: Not yet implemented, lacking device context");
        return QRectF();
    }

    return context->painter->worldTransform().mapRect(m_widget->rect());
}